

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 get_program(int argc,char **argv)

{
  undefined8 *in_RDX;
  undefined4 in_register_0000003c;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> this;
  char *local_50;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>
  local_30;
  char *local_28;
  char *program_name;
  char **argv_local;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> _Stack_10;
  int argc_local;
  
  this._M_head_impl._4_4_ = in_register_0000003c;
  this._M_head_impl._0_4_ = argc;
  argv_local._4_4_ = (int)argv;
  _Stack_10._M_head_impl = this._M_head_impl;
  if (2 < argv_local._4_4_) {
    if (argv_local._4_4_ < 1) {
      local_50 = "[program]";
    }
    else {
      local_50 = (char *)*in_RDX;
    }
    local_28 = local_50;
    ublib::failwith<void,char[8],char_const*,char[20]>
              ((char (*) [8])"Usage: ",&local_28,(char (*) [20])" [filename=code.lc]");
  }
  if (argv_local._4_4_ == 2) {
    std::make_unique<std::fstream,char_const*const&,std::_Ios_Openmode_const&>
              ((char **)&local_30,(_Ios_Openmode *)(in_RDX + 1));
    std::unique_ptr<std::istream,std::default_delete<std::istream>>::
    unique_ptr<std::fstream,std::default_delete<std::fstream>,void>
              ((unique_ptr<std::istream,std::default_delete<std::istream>> *)this._M_head_impl,
               &local_30);
    std::
    unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>
    ::~unique_ptr(&local_30);
  }
  else {
    std::make_unique<std::__cxx11::stringstream,char_const*const&>((char **)&local_38);
    std::unique_ptr<std::istream,std::default_delete<std::istream>>::
    unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>,void>
              ((unique_ptr<std::istream,std::default_delete<std::istream>> *)this._M_head_impl,
               &local_38);
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&local_38);
  }
  return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )this._M_head_impl;
}

Assistant:

std::unique_ptr<std::istream> get_program(int argc, char const* const* argv) {
  if (argc > 2) {
    auto const program_name = (argc > 0) ? argv[0] : "[program]";
    ublib::failwith("Usage: ", program_name, " [filename=code.lc]");
  } else if (argc == 2) {
    return std::make_unique<std::fstream>(argv[1], std::ios_base::in);
  } else {
    return std::make_unique<std::stringstream>(default_program);
  }
}